

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# facets.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  Person p;
  allocator<char> local_37d;
  allocator<char> local_37c;
  allocator<char> local_37b;
  allocator<char> local_37a;
  allocator<char> local_379;
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  PersonBuilder local_2d8;
  PersonBuilder local_220;
  Person local_168;
  PersonBuilder local_c0;
  
  Person::create();
  PersonBuilder::lives(&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2f8,"Beverly Hills, Rodeo Drive",&local_379);
  std::__cxx11::string::operator=((string *)local_2d8.person_reference,local_2f8);
  std::__cxx11::string::string<std::allocator<char>>(local_318,"90210",&local_37a);
  std::__cxx11::string::operator=((string *)&(local_2d8.person_reference)->post_code,local_318);
  std::__cxx11::string::string<std::allocator<char>>(local_338,"Los Angeles",&local_37b);
  std::__cxx11::string::operator=((string *)&(local_2d8.person_reference)->city,local_338);
  PersonBuilder::works(&local_2d8);
  std::__cxx11::string::string<std::allocator<char>>(local_358,"SoftwareCorp",&local_37c);
  std::__cxx11::string::operator=((string *)&(local_220.person_reference)->company_name,local_358);
  std::__cxx11::string::string<std::allocator<char>>(local_378,"Software Engineer",&local_37d);
  std::__cxx11::string::operator=((string *)&(local_220.person_reference)->position,local_378);
  (local_220.person_reference)->annual_income = 10000000;
  PersonBuilder::operator_cast_to_Person(&local_168,&local_220);
  std::__cxx11::string::~string(local_378);
  std::__cxx11::string::~string(local_358);
  std::_Optional_payload_base<Person>::_M_reset((_Optional_payload_base<Person> *)&local_220);
  std::__cxx11::string::~string(local_338);
  std::__cxx11::string::~string(local_318);
  std::__cxx11::string::~string(local_2f8);
  std::_Optional_payload_base<Person>::_M_reset((_Optional_payload_base<Person> *)&local_2d8);
  std::_Optional_payload_base<Person>::_M_reset((_Optional_payload_base<Person> *)&local_c0);
  poVar1 = operator<<((ostream *)&std::cout,&local_168);
  std::endl<char,std::char_traits<char>>(poVar1);
  Person::~Person(&local_168);
  return 0;
}

Assistant:

int main()
{
	Person p(Person::create()
		.lives().at("Beverly Hills, Rodeo Drive").with_postcode("90210").in("Los Angeles")
		.works().at("SoftwareCorp").as_a("Software Engineer").earning(int(10e6)));
	std::cout << p << std::endl;

	return 0;
}